

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_dec.c
# Opt level: O3

int ExportAlphaRGBA4444(WebPDecParams *p,int y_pos,int max_lines_out)

{
  WEBP_CSP_MODE WVar1;
  uint uVar2;
  WebPDecBuffer *pWVar3;
  byte bVar4;
  ulong uVar5;
  int iVar6;
  byte bVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  WebPRescaler *wrk;
  int iVar10;
  bool bVar11;
  
  wrk = p->scaler_a;
  iVar10 = 0;
  if (wrk->dst_y < wrk->dst_height) {
    pWVar3 = p->output;
    iVar6 = (pWVar3->u).RGBA.stride;
    WVar1 = pWVar3->colorspace;
    uVar2 = wrk->dst_width;
    puVar9 = (pWVar3->u).RGBA.rgba + (long)y_pos * (long)iVar6;
    if (max_lines_out < 1 || 0 < wrk->y_accum) {
      iVar10 = 0;
      bVar11 = false;
    }
    else {
      puVar8 = puVar9 + 1;
      bVar7 = 0xf;
      iVar10 = 0;
      do {
        WebPRescalerExportRow(wrk);
        if (0 < (int)uVar2) {
          uVar5 = 0;
          do {
            bVar4 = p->scaler_a->dst[uVar5] >> 4;
            puVar8[uVar5 * 2] = puVar8[uVar5 * 2] & 0xf0 | bVar4;
            bVar7 = bVar7 & bVar4;
            uVar5 = uVar5 + 1;
          } while (uVar2 != uVar5);
        }
        iVar6 = (pWVar3->u).RGBA.stride;
        iVar10 = iVar10 + 1;
        wrk = p->scaler_a;
      } while (((wrk->dst_y < wrk->dst_height) && (wrk->y_accum < 1)) &&
              (puVar8 = puVar8 + iVar6, iVar10 < max_lines_out));
      bVar11 = bVar7 != 0xf;
    }
    if ((WVar1 - MODE_rgbA < 4) && (bVar11)) {
      (*WebPApplyAlphaMultiply4444)(puVar9,uVar2,iVar10,iVar6);
    }
  }
  return iVar10;
}

Assistant:

static int ExportAlphaRGBA4444(WebPDecParams* const p, int y_pos,
                               int max_lines_out) {
  const WebPRGBABuffer* const buf = &p->output->u.RGBA;
  uint8_t* const base_rgba = buf->rgba + (size_t)y_pos * buf->stride;
#if (WEBP_SWAP_16BIT_CSP == 1)
  uint8_t* alpha_dst = base_rgba;
#else
  uint8_t* alpha_dst = base_rgba + 1;
#endif
  int num_lines_out = 0;
  const WEBP_CSP_MODE colorspace = p->output->colorspace;
  const int width = p->scaler_a->dst_width;
  const int is_premult_alpha = WebPIsPremultipliedMode(colorspace);
  uint32_t alpha_mask = 0x0f;

  while (WebPRescalerHasPendingOutput(p->scaler_a) &&
         num_lines_out < max_lines_out) {
    int i;
    assert(y_pos + num_lines_out < p->output->height);
    WebPRescalerExportRow(p->scaler_a);
    for (i = 0; i < width; ++i) {
      // Fill in the alpha value (converted to 4 bits).
      const uint32_t alpha_value = p->scaler_a->dst[i] >> 4;
      alpha_dst[2 * i] = (alpha_dst[2 * i] & 0xf0) | alpha_value;
      alpha_mask &= alpha_value;
    }
    alpha_dst += buf->stride;
    ++num_lines_out;
  }
  if (is_premult_alpha && alpha_mask != 0x0f) {
    WebPApplyAlphaMultiply4444(base_rgba, width, num_lines_out, buf->stride);
  }
  return num_lines_out;
}